

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O1

int amqp_send_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  ushort uVar1;
  uint8_t *buf;
  ulong uVar2;
  uint8_t res;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  uint64_t uVar6;
  int unaff_R15D;
  uint uVar7;
  amqp_bytes_t encoded;
  amqp_bytes_t encoded_00;
  uint8_t frame_end_byte;
  iovec iov [3];
  undefined1 local_59;
  iovec local_58;
  void *local_48;
  size_t local_40;
  undefined1 *local_38;
  undefined8 local_30;
  
  buf = (uint8_t *)(state->outbound_buffer).bytes;
  *buf = frame->frame_type;
  *(amqp_channel_t *)(buf + 1) = frame->channel << 8 | frame->channel >> 8;
  uVar7 = 0;
  bVar3 = false;
  iVar4 = -10;
  switch(frame->frame_type) {
  case '\x01':
    uVar7 = (frame->payload).method.id;
    *(uint *)(buf + 7) =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    encoded.len = (state->outbound_buffer).len - 0xc;
    encoded.bytes = buf + 0xb;
    iVar4 = amqp_encode_method((frame->payload).method.id,(frame->payload).method.decoded,encoded);
    if (-1 < iVar4) {
      uVar7 = iVar4 + 4;
      goto switchD_0010a05e_caseD_8;
    }
LAB_0010a160:
    bVar3 = false;
    unaff_R15D = iVar4;
    break;
  case '\x02':
    uVar1 = (frame->payload).properties.class_id;
    *(ushort *)(buf + 7) = uVar1 << 8 | uVar1 >> 8;
    buf[9] = '\0';
    buf[10] = '\0';
    uVar2 = (frame->payload).properties.body_size;
    *(ulong *)(buf + 0xb) =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    encoded_00.len = (state->outbound_buffer).len - 0x14;
    encoded_00.bytes = buf + 0x13;
    iVar4 = amqp_encode_properties
                      ((frame->payload).properties.class_id,(frame->payload).properties.decoded,
                       encoded_00);
    if (iVar4 < 0) goto LAB_0010a160;
    uVar7 = iVar4 + 0xc;
  case '\b':
switchD_0010a05e_caseD_8:
    *(uint *)(buf + 3) =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    buf[(ulong)uVar7 + 7] = 0xce;
    sVar5 = amqp_socket_send(state->socket,buf,(ulong)uVar7 + 8);
    bVar3 = true;
    iVar4 = -10;
    unaff_R15D = (int)sVar5;
    break;
  case '\x03':
    local_38 = &local_59;
    local_59 = 0xce;
    uVar7 = (frame->payload).method.id;
    *(uint *)(buf + 3) =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    local_58.iov_len = 7;
    local_48 = (frame->payload).method.decoded;
    local_40 = (frame->payload).body_fragment.len;
    local_30 = 1;
    local_58.iov_base = buf;
    sVar5 = amqp_socket_writev(state->socket,&local_58,3);
    unaff_R15D = (int)sVar5;
    goto LAB_0010a16b;
  }
  if (bVar3) {
LAB_0010a16b:
    iVar4 = unaff_R15D;
    if (0 < state->heartbeat) {
      uVar6 = amqp_get_monotonic_timestamp();
      if (uVar6 == 0) {
        iVar4 = -0xe;
      }
      else {
        state->next_send_heartbeat = (long)state->heartbeat * 1000000000 + uVar6;
      }
    }
  }
  return iVar4;
}

Assistant:

int amqp_send_frame(amqp_connection_state_t state,
                    const amqp_frame_t *frame)
{
  void *out_frame = state->outbound_buffer.bytes;
  int res;

  amqp_e8(out_frame, 0, frame->frame_type);
  amqp_e16(out_frame, 1, frame->channel);

  if (frame->frame_type == AMQP_FRAME_BODY) {
    /* For a body frame, rather than copying data around, we use
       writev to compose the frame */
    struct iovec iov[3];
    uint8_t frame_end_byte = AMQP_FRAME_END;
    const amqp_bytes_t *body = &frame->payload.body_fragment;

    amqp_e32(out_frame, 3, body->len);

    iov[0].iov_base = out_frame;
    iov[0].iov_len = HEADER_SIZE;
    iov[1].iov_base = body->bytes;
    iov[1].iov_len = body->len;
    iov[2].iov_base = &frame_end_byte;
    iov[2].iov_len = FOOTER_SIZE;

    res = amqp_socket_writev(state->socket, iov, 3);
  } else {
    size_t out_frame_len;
    amqp_bytes_t encoded;

    switch (frame->frame_type) {
    case AMQP_FRAME_METHOD:
      amqp_e32(out_frame, HEADER_SIZE, frame->payload.method.id);

      encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 4);
      encoded.len = state->outbound_buffer.len - HEADER_SIZE - 4 - FOOTER_SIZE;

      res = amqp_encode_method(frame->payload.method.id,
                               frame->payload.method.decoded, encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 4;
      break;

    case AMQP_FRAME_HEADER:
      amqp_e16(out_frame, HEADER_SIZE, frame->payload.properties.class_id);
      amqp_e16(out_frame, HEADER_SIZE+2, 0); /* "weight" */
      amqp_e64(out_frame, HEADER_SIZE+4, frame->payload.properties.body_size);

      encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 12);
      encoded.len = state->outbound_buffer.len - HEADER_SIZE - 12 - FOOTER_SIZE;

      res = amqp_encode_properties(frame->payload.properties.class_id,
                                   frame->payload.properties.decoded, encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 12;
      break;

    case AMQP_FRAME_HEARTBEAT:
      out_frame_len = 0;
      break;

    default:
      return AMQP_STATUS_INVALID_PARAMETER;
    }

    amqp_e32(out_frame, 3, out_frame_len);
    amqp_e8(out_frame, out_frame_len + HEADER_SIZE, AMQP_FRAME_END);
    res = amqp_socket_send(state->socket, out_frame,
                           out_frame_len + HEADER_SIZE + FOOTER_SIZE);
  }

  if (state->heartbeat > 0) {
    uint64_t current_time = amqp_get_monotonic_timestamp();
    if (0 == current_time) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
    state->next_send_heartbeat = amqp_calc_next_send_heartbeat(state, current_time);
  }

  return res;
}